

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

void xmlRaiseMemoryError(xmlStructuredErrorFunc schannel,xmlGenericErrorFunc channel,void *data,
                        int domain,xmlError *error)

{
  xmlError *pxVar1;
  xmlStructuredErrorFunc *pp_Var2;
  void **ppvVar3;
  
  pxVar1 = xmlGetLastErrorInternal();
  xmlResetLastError();
  pxVar1->domain = domain;
  pxVar1->code = 2;
  pxVar1->level = XML_ERR_FATAL;
  if (error != (xmlError *)0x0) {
    xmlResetError(error);
    error->domain = domain;
    error->code = 2;
    error->level = XML_ERR_FATAL;
  }
  if (schannel == (xmlStructuredErrorFunc)0x0) {
    pp_Var2 = __xmlStructuredError();
    if (*pp_Var2 == (xmlStructuredErrorFunc)0x0) {
      if (channel == (xmlGenericErrorFunc)0x0) {
        return;
      }
      (*channel)(data,"libxml2: out of memory\n");
      return;
    }
    pp_Var2 = __xmlStructuredError();
    schannel = *pp_Var2;
    ppvVar3 = __xmlStructuredErrorContext();
    data = *ppvVar3;
  }
  (*schannel)(data,pxVar1);
  return;
}

Assistant:

void
xmlRaiseMemoryError(xmlStructuredErrorFunc schannel, xmlGenericErrorFunc channel,
                    void *data, int domain, xmlError *error)
{
    xmlError *lastError = xmlGetLastErrorInternal();

    xmlResetLastError();
    lastError->domain = domain;
    lastError->code = XML_ERR_NO_MEMORY;
    lastError->level = XML_ERR_FATAL;

    if (error != NULL) {
        xmlResetError(error);
        error->domain = domain;
        error->code = XML_ERR_NO_MEMORY;
        error->level = XML_ERR_FATAL;
    }

    if (schannel != NULL) {
        schannel(data, lastError);
    } else if (xmlStructuredError != NULL) {
        xmlStructuredError(xmlStructuredErrorContext, lastError);
    } else if (channel != NULL) {
        channel(data, "libxml2: out of memory\n");
    }
}